

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Pooling3DLayerParams::MergeFrom
          (Pooling3DLayerParams *this,Pooling3DLayerParams *from)

{
  bool bVar1;
  Pooling3DLayerParams_PoolingType3D PVar2;
  int32 iVar3;
  Pooling3DLayerParams_Pooling3DPaddingType PVar4;
  LogMessage *other;
  InternalMetadataWithArenaLite *this_00;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  Pooling3DLayerParams *local_58;
  Pooling3DLayerParams *from_local;
  Pooling3DLayerParams *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x82e2);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (Pooling3DLayerParams *)&local_58->_internal_metadata_;
  local_40 = this_00;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_00,&local_20->unknown_fields);
  }
  PVar2 = type(local_58);
  if (PVar2 != Pooling3DLayerParams_PoolingType3D_MAX) {
    PVar2 = type(local_58);
    set_type(this,PVar2);
  }
  iVar3 = kerneldepth(local_58);
  if (iVar3 != 0) {
    iVar3 = kerneldepth(local_58);
    set_kerneldepth(this,iVar3);
  }
  iVar3 = kernelheight(local_58);
  if (iVar3 != 0) {
    iVar3 = kernelheight(local_58);
    set_kernelheight(this,iVar3);
  }
  iVar3 = kernelwidth(local_58);
  if (iVar3 != 0) {
    iVar3 = kernelwidth(local_58);
    set_kernelwidth(this,iVar3);
  }
  iVar3 = stridedepth(local_58);
  if (iVar3 != 0) {
    iVar3 = stridedepth(local_58);
    set_stridedepth(this,iVar3);
  }
  iVar3 = strideheight(local_58);
  if (iVar3 != 0) {
    iVar3 = strideheight(local_58);
    set_strideheight(this,iVar3);
  }
  iVar3 = stridewidth(local_58);
  if (iVar3 != 0) {
    iVar3 = stridewidth(local_58);
    set_stridewidth(this,iVar3);
  }
  iVar3 = custompaddingfront(local_58);
  if (iVar3 != 0) {
    iVar3 = custompaddingfront(local_58);
    set_custompaddingfront(this,iVar3);
  }
  iVar3 = custompaddingback(local_58);
  if (iVar3 != 0) {
    iVar3 = custompaddingback(local_58);
    set_custompaddingback(this,iVar3);
  }
  iVar3 = custompaddingtop(local_58);
  if (iVar3 != 0) {
    iVar3 = custompaddingtop(local_58);
    set_custompaddingtop(this,iVar3);
  }
  iVar3 = custompaddingbottom(local_58);
  if (iVar3 != 0) {
    iVar3 = custompaddingbottom(local_58);
    set_custompaddingbottom(this,iVar3);
  }
  iVar3 = custompaddingleft(local_58);
  if (iVar3 != 0) {
    iVar3 = custompaddingleft(local_58);
    set_custompaddingleft(this,iVar3);
  }
  iVar3 = custompaddingright(local_58);
  if (iVar3 != 0) {
    iVar3 = custompaddingright(local_58);
    set_custompaddingright(this,iVar3);
  }
  bVar1 = countexcludepadding(local_58);
  if (bVar1) {
    bVar1 = countexcludepadding(local_58);
    set_countexcludepadding(this,bVar1);
  }
  PVar4 = paddingtype(local_58);
  if (PVar4 != Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    PVar4 = paddingtype(local_58);
    set_paddingtype(this,PVar4);
  }
  return;
}

Assistant:

void Pooling3DLayerParams::MergeFrom(const Pooling3DLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Pooling3DLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.type() != 0) {
    set_type(from.type());
  }
  if (from.kerneldepth() != 0) {
    set_kerneldepth(from.kerneldepth());
  }
  if (from.kernelheight() != 0) {
    set_kernelheight(from.kernelheight());
  }
  if (from.kernelwidth() != 0) {
    set_kernelwidth(from.kernelwidth());
  }
  if (from.stridedepth() != 0) {
    set_stridedepth(from.stridedepth());
  }
  if (from.strideheight() != 0) {
    set_strideheight(from.strideheight());
  }
  if (from.stridewidth() != 0) {
    set_stridewidth(from.stridewidth());
  }
  if (from.custompaddingfront() != 0) {
    set_custompaddingfront(from.custompaddingfront());
  }
  if (from.custompaddingback() != 0) {
    set_custompaddingback(from.custompaddingback());
  }
  if (from.custompaddingtop() != 0) {
    set_custompaddingtop(from.custompaddingtop());
  }
  if (from.custompaddingbottom() != 0) {
    set_custompaddingbottom(from.custompaddingbottom());
  }
  if (from.custompaddingleft() != 0) {
    set_custompaddingleft(from.custompaddingleft());
  }
  if (from.custompaddingright() != 0) {
    set_custompaddingright(from.custompaddingright());
  }
  if (from.countexcludepadding() != 0) {
    set_countexcludepadding(from.countexcludepadding());
  }
  if (from.paddingtype() != 0) {
    set_paddingtype(from.paddingtype());
  }
}